

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

Type convertToExtendedType(QCborContainerPrivate *d)

{
  QByteArray *this;
  iterator pcVar1;
  QCborContainerPrivate *pQVar2;
  Data DVar3;
  Data data;
  storage_type_conflict *psVar4;
  bool bVar5;
  pointer pEVar6;
  QString *this_00;
  iterator pcVar7;
  qptrdiff qVar8;
  undefined8 in_RCX;
  storage_type *psVar9;
  ulong uVar10;
  Type TVar11;
  qint64 msecs;
  char *pcVar12;
  ByteData *this_01;
  long in_FS_OFFSET;
  double dVar13;
  QByteArrayView ba;
  QStringView string;
  QDateTime dt;
  char buf [16];
  Data local_78 [3];
  Data local_60;
  Data local_58;
  Data DStack_50;
  storage_type_conflict *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (((d->elements).d.ptr)->field_0).container;
  pEVar6 = QList<QtCbor::Element>::data(&d->elements);
  uVar10._0_4_ = pEVar6[1].type;
  uVar10._4_4_ = pEVar6[1].flags;
  pcVar12 = (d->data).d.ptr;
  if (pcVar12 == (char *)0x0) {
    pcVar12 = &QByteArray::_empty;
  }
  this_01 = (ByteData *)(pcVar12 + pEVar6[1].field_0.value);
  if ((long)pQVar2 < 0x23) {
    if (pQVar2 < (QCborContainerPrivate *)0x2) {
      local_60.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QDateTime::QDateTime((QDateTime *)&local_60.data);
      psVar9 = (storage_type *)
               CONCAT71((int7)((ulong)in_RCX >> 8),pQVar2 == (QCborContainerPrivate *)0x0);
      TVar11 = pEVar6[1].type;
      if ((TVar11 == String & (byte)((uint)uVar10._4_4_ >> 1) & 1 &
          pQVar2 == (QCborContainerPrivate *)0x0) == 1) {
        if ((pEVar6[1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
             super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 4) == 0) {
          this_00 = (QString *)this_01->len;
          if ((long)this_00 < 0) {
            this_00 = (QString *)strlen((char *)(this_01 + 1));
          }
          ba.m_data = psVar9;
          ba.m_size = (qsizetype)(this_01 + 1);
          QString::fromLatin1((QString *)&local_58.data,this_00,ba);
          data = local_58;
          string.m_data = local_48;
          string.m_size = (qsizetype)local_78;
          QDateTime::fromString(string,DStack_50._0_4_);
          DVar3 = local_60;
          local_60 = local_78[0];
          local_78[0] = DVar3;
          QDateTime::~QDateTime((QDateTime *)&local_78[0].data);
          if (data.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
            _M_i = (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)data.d,2,0x10);
            }
          }
        }
      }
      else if (pQVar2 == (QCborContainerPrivate *)0x1) {
        if (TVar11 == Double) {
          dVar13 = round((double)pEVar6[1].field_0 * 1000.0);
          msecs = (qint64)dVar13;
          if (((msecs != -0x8000000000000000) || (dVar13 == -9.223372036854776e+18)) &&
             (dVar13 == (double)msecs)) goto LAB_002e102d;
        }
        else if ((TVar11 == Integer) &&
                (msecs = pEVar6[1].field_0.value * 1000,
                SEXT816(msecs) == SEXT816(pEVar6[1].field_0.value) * SEXT416(1000))) {
LAB_002e102d:
          local_78[0] = (Data)0x2;
          QDateTime::fromMSecsSinceEpoch
                    ((QDateTime *)&local_58.data,msecs,(QTimeZone *)&local_78[0].data);
          DVar3 = local_60;
          local_60.d = local_58.d;
          local_58.d = DVar3.d;
          QDateTime::~QDateTime((QDateTime *)&local_58.data);
          QTimeZone::~QTimeZone((QTimeZone *)&local_78[0].data);
        }
      }
      bVar5 = QDateTime::isValid((QDateTime *)&local_60.data);
      if (bVar5) {
        local_48 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        DStack_50.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QDateTime::toString((QString *)&local_78[0].data,(QDateTime *)&local_60.data,ISODateWithMs);
        QString::toLatin1_helper_inplace((QByteArray *)&local_58.data,(QString *)&local_78[0].data);
        if (local_78[0].d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_78[0].d)->super_QSharedData)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_78[0].d)->super_QSharedData)->_q_value).
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_78[0].d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78[0].d,2,0x10);
          }
        }
        psVar4 = local_48;
        pcVar12 = (char *)DStack_50;
        if (local_48 != (storage_type_conflict *)0x0) {
          QByteArray::clear(&d->data);
          if ((QDateTimePrivate *)pcVar12 == (QDateTimePrivate *)0x0) {
            pcVar12 = &QByteArray::_empty;
          }
          d->usedData = 0;
          pEVar6[1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 10;
          qVar8 = QCborContainerPrivate::addByteDataImpl
                            (&d->data,&d->usedData,pcVar12,(qsizetype)psVar4);
          pEVar6[1].field_0.value = qVar8;
          pEVar6[1].type = String;
          pEVar6 = QList<QtCbor::Element>::data(&d->elements);
          (pEVar6->field_0).value = 0;
          if (local_58.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_58.d,1,0x10);
            }
          }
          QDateTime::~QDateTime((QDateTime *)&local_60.data);
          TVar11 = DateTime;
          goto LAB_002e11a1;
        }
        if (local_58.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i = (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                  super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58.d,1,0x10);
          }
        }
      }
      QDateTime::~QDateTime((QDateTime *)&local_60.data);
    }
    else if ((pQVar2 == (QCborContainerPrivate *)0x20) && ((undefined4)uVar10 == 0x60)) {
      TVar11 = Url;
      if ((uVar10 >> 0x21 & 1) != 0) {
        local_60.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        if ((uVar10 >> 0x22 & 1) == 0) {
          QtCbor::ByteData::toUtf8String((QString *)&local_58.data,this_01);
        }
        else {
          QString::fromRawData((QChar *)(this_01 + 1),this_01->len / 2);
        }
        QUrl::QUrl((QUrl *)&local_60.data,(QString *)&local_58.data,StrictMode);
        if (local_58.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i = (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                  super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58.d,2,0x10);
          }
        }
        bVar5 = QUrl::isValid((QUrl *)&local_60.data);
        if (bVar5) {
          local_48 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          DStack_50.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::toString((QString *)&local_78[0].data,(QUrl *)&local_60.data,
                         (FormattingOptions)0x2000000);
          QString::toUtf8_helper((QByteArray *)&local_58.data,(QString *)&local_78[0].data);
          if (local_78[0].d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_78[0].d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_78[0].d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_78[0].d)->super_QSharedData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_78[0].d,2,0x10);
            }
          }
          psVar4 = local_48;
          pcVar12 = (char *)DStack_50;
          QByteArray::clear(&d->data);
          if ((QDateTimePrivate *)pcVar12 == (QDateTimePrivate *)0x0) {
            pcVar12 = &QByteArray::_empty;
          }
          d->usedData = 0;
          pEVar6[1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 2;
          qVar8 = QCborContainerPrivate::addByteDataImpl
                            (&d->data,&d->usedData,pcVar12,(qsizetype)psVar4);
          pEVar6[1].field_0.value = qVar8;
          if (local_58.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_58.d,1,0x10);
            }
          }
        }
        QUrl::~QUrl((QUrl *)&local_60.data);
      }
      goto LAB_002e11a1;
    }
  }
  else if (pQVar2 == (QCborContainerPrivate *)0x23) {
    TVar11 = RegularExpression;
    if ((undefined4)uVar10 == 0x60) goto LAB_002e11a1;
  }
  else if ((pQVar2 == (QCborContainerPrivate *)0x25) && ((undefined4)uVar10 == 0x40)) {
    local_58.d = (QDateTimePrivate *)0x0;
    DStack_50.d = (QDateTimePrivate *)0x0;
    if ((uVar10 >> 0x21 & 1) != 0) {
      uVar10 = this_01->len;
      if (0xf < uVar10) {
        uVar10 = 0x10;
      }
      __memcpy_chk(&local_58,this_01 + 1,uVar10,0x10);
    }
    this = &d->data;
    QByteArray::clear(this);
    d->usedData = 0;
    pEVar6[1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 2;
    uVar10 = (d->data).d.size + 7U & 0x7ffffffffffffff8;
    d->usedData = d->usedData + 0x18;
    QByteArray::resize(this,uVar10 + 0x18);
    pcVar7 = QByteArray::begin(this);
    pcVar1 = pcVar7 + uVar10;
    pcVar1[0] = '\x10';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(Data *)(pcVar7 + uVar10 + 8) = local_58;
    ((Data *)(pcVar7 + uVar10 + 8))[1] = DStack_50;
    pEVar6[1].field_0.value = uVar10;
    TVar11 = Uuid;
    goto LAB_002e11a1;
  }
  TVar11 = Tag;
LAB_002e11a1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return TVar11;
}

Assistant:

static QCborValue::Type convertToExtendedType(QCborContainerPrivate *d)
{
    qint64 tag = d->elements.at(0).value;
    auto &e = d->elements[1];
    const ByteData *b = d->byteData(e);

    auto replaceByteData = [&](const char *buf, qsizetype len, Element::ValueFlags f) {
        d->data.clear();
        d->usedData = 0;
        e.flags = Element::HasByteData | f;
        e.value = d->addByteData(buf, len);
    };

    switch (tag) {
#if QT_CONFIG(datestring)
    case qint64(QCborKnownTags::DateTimeString):
    case qint64(QCborKnownTags::UnixTime_t): {
        QDateTime dt;
        if (tag == qint64(QCborKnownTags::DateTimeString) && b &&
            e.type == QCborValue::String && (e.flags & Element::StringIsUtf16) == 0) {
            // The data is supposed to be US-ASCII. If it isn't (contains UTF-8),
            // QDateTime::fromString will fail anyway.
            dt = QDateTime::fromString(b->asLatin1(), Qt::ISODateWithMs);
        } else if (tag == qint64(QCborKnownTags::UnixTime_t)) {
            qint64 msecs;
            bool ok = false;
            if (e.type == QCborValue::Integer) {
#if QT_POINTER_SIZE == 8
                // we don't have a fast 64-bit qMulOverflow implementation on
                // 32-bit architectures.
                ok = !qMulOverflow(e.value, qint64(1000), &msecs);
#else
                static const qint64 Limit = std::numeric_limits<qint64>::max() / 1000;
                ok = (e.value > -Limit && e.value < Limit);
                if (ok)
                    msecs = e.value * 1000;
#endif
            } else if (e.type == QCborValue::Double) {
                ok = convertDoubleTo(round(e.fpvalue() * 1000), &msecs);
            }
            if (ok)
                dt = QDateTime::fromMSecsSinceEpoch(msecs, QTimeZone::UTC);
        }
        if (dt.isValid()) {
            QByteArray text = dt.toString(Qt::ISODateWithMs).toLatin1();
            if (!text.isEmpty()) {
                replaceByteData(text, text.size(), Element::StringIsAscii);
                e.type = QCborValue::String;
                d->elements[0].value = qint64(QCborKnownTags::DateTimeString);
                return QCborValue::DateTime;
            }
        }
        break;
    }
#endif

#ifndef QT_BOOTSTRAPPED
    case qint64(QCborKnownTags::Url):
        if (e.type == QCborValue::String) {
            if (b) {
                // normalize to a short (decoded) form, so as to save space
                QUrl url(e.flags & Element::StringIsUtf16 ?
                             b->asQStringRaw() :
                             b->toUtf8String(), QUrl::StrictMode);
                if (url.isValid()) {
                    QByteArray encoded = url.toString(QUrl::DecodeReserved).toUtf8();
                    replaceByteData(encoded, encoded.size(), {});
                }
            }
            return QCborValue::Url;
        }
        break;
#endif // QT_BOOTSTRAPPED

#if QT_CONFIG(regularexpression)
    case quint64(QCborKnownTags::RegularExpression):
        if (e.type == QCborValue::String) {
            // no normalization is necessary
            return QCborValue::RegularExpression;
        }
        break;
#endif // QT_CONFIG(regularexpression)

    case qint64(QCborKnownTags::Uuid):
        if (e.type == QCborValue::ByteArray) {
            // force the size to 16
            char buf[sizeof(QUuid)] = {};
            if (b)
                memcpy(buf, b->byte(), qMin(sizeof(buf), size_t(b->len)));
            replaceByteData(buf, sizeof(buf), {});

            return QCborValue::Uuid;
        }
        break;
    }

    // no enriching happened
    return QCborValue::Tag;
}